

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Outlining.cpp
# Opt level: O0

void __thiscall
wasm::ReconstructStringifyWalker::addUniqueSymbol
          (ReconstructStringifyWalker *this,SeparatorReason reason)

{
  Block *curr_00;
  If *iff;
  Loop *loop;
  FuncStart *pFVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ElseStart *pEVar3;
  End *pEVar4;
  Fatal local_ac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_940;
  Err *err_5;
  Result<wasm::Expression_*> _val_5;
  Err *err_4;
  Result<wasm::Ok> _val_4;
  Err *err_3;
  undefined1 local_5c0 [8];
  Result<wasm::Ok> _val_3;
  LoopStart *curr_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_408;
  Err *err_2;
  Result<wasm::Ok> _val_2;
  Err *err_1;
  string_view local_240;
  undefined1 local_230 [8];
  Result<wasm::Ok> _val_1;
  IfStart *curr_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  Err *err;
  undefined1 local_58 [8];
  Result<wasm::Ok> _val;
  BlockStart *curr_1;
  FuncStart *curr;
  ReconstructStringifyWalker *this_local;
  SeparatorReason reason_local;
  
  pFVar1 = StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::getFuncStart
                     ((SeparatorReason *)&this_local);
  if (pFVar1 == (FuncStart *)0x0) {
    this->instrCounter = this->instrCounter + 1;
    _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _32_8_ = StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::getBlockStart
                       ((SeparatorReason *)&this_local);
    if ((BlockStart *)
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ == (BlockStart *)0x0) {
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ =
           StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::getIfStart
                     ((SeparatorReason *)&this_local);
      if ((IfStart *)
          _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ == (IfStart *)0x0) {
        pEVar3 = StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::getElseStart
                           ((SeparatorReason *)&this_local);
        if (pEVar3 == (ElseStart *)0x0) {
          _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ =
               StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::getLoopStart
                         ((SeparatorReason *)&this_local);
          if ((LoopStart *)
              _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ == (LoopStart *)0x0) {
            pEVar4 = StringifyWalker<wasm::ReconstructStringifyWalker>::SeparatorReason::getEnd
                               ((SeparatorReason *)&this_local);
            if (pEVar4 == (End *)0x0) {
              handle_unreachable("unimplemented control flow",
                                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Outlining.cpp"
                                 ,0x9c);
            }
            IRBuilder::visitEnd((Result<wasm::Ok> *)&err_4,&this->existingBuilder);
            pbVar2 = &Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_4)->msg;
            if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
            {
              Fatal::Fatal((Fatal *)((long)&_val_5.val.
                                            super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                            super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                            super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                            super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                            super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> +
                                    0x20));
              Fatal::operator<<((Fatal *)((long)&_val_5.val.
                                                 super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                                 super__Move_assign_alias<wasm::Expression_*,_wasm::Err>
                                                 .
                                                 super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>
                                                 .
                                                 super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>
                                                 .
                                                 super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>
                                         + 0x20),pbVar2);
              Fatal::~Fatal((Fatal *)((long)&_val_5.val.
                                             super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                             super__Move_assign_alias<wasm::Expression_*,_wasm::Err>
                                             .
                                             super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>
                                             .super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                             super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> +
                                     0x20));
            }
            Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_4);
            IRBuilder::setFunction(&this->existingBuilder,this->func);
            IRBuilder::build((Result<wasm::Expression_*> *)&err_5,&this->existingBuilder);
            local_940 = &Result<wasm::Expression_*>::getErr((Result<wasm::Expression_*> *)&err_5)->
                         msg;
            if (local_940 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              Fatal::Fatal(&local_ac8);
              Fatal::operator<<(&local_ac8,local_940);
              Fatal::~Fatal(&local_ac8);
            }
            Result<wasm::Expression_*>::~Result((Result<wasm::Expression_*> *)&err_5);
          }
          else {
            loop = ((LoopStart *)
                   _val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_)->loop;
            wasm::Type::Type((Type *)&err_3,none);
            IRBuilder::visitLoopStart
                      ((Result<wasm::Ok> *)local_5c0,&this->existingBuilder,loop,(Type)err_3);
            pbVar2 = &Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_5c0)->msg;
            if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
            {
              Fatal::Fatal((Fatal *)((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              Fatal::operator<<((Fatal *)((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>
                                                 .super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20)
                                ,pbVar2);
              Fatal::~Fatal((Fatal *)((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            }
            Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_5c0);
          }
        }
        else {
          IRBuilder::visitElse((Result<wasm::Ok> *)&err_2,&this->existingBuilder);
          local_408 = &Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_2)->msg;
          if (local_408 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            Fatal::Fatal((Fatal *)&curr_3);
            Fatal::operator<<((Fatal *)&curr_3,local_408);
            Fatal::~Fatal((Fatal *)&curr_3);
          }
          Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_2);
        }
      }
      else {
        IRBuilder::push(&this->existingBuilder,
                        ((IfStart *)
                        _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_)->iff->condition);
        iff = *(If **)_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
        wasm::Name::Name((Name *)&local_240);
        wasm::Type::Type((Type *)&err_1,none);
        IRBuilder::visitIfStart
                  ((Result<wasm::Ok> *)local_230,&this->existingBuilder,iff,(Name)local_240,
                   (Type)err_1);
        pbVar2 = &Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_230)->msg;
        if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          Fatal::Fatal((Fatal *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          Fatal::operator<<((Fatal *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                            pbVar2);
          Fatal::~Fatal((Fatal *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        }
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_230);
      }
    }
    else {
      curr_00 = ((BlockStart *)
                _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_)->block;
      wasm::Type::Type((Type *)&err,none);
      IRBuilder::visitBlockStart
                ((Result<wasm::Ok> *)local_58,&this->existingBuilder,curr_00,(Type)err);
      local_68 = &Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_58)->msg;
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        Fatal::Fatal((Fatal *)&curr_2);
        Fatal::operator<<((Fatal *)&curr_2,local_68);
        Fatal::~Fatal((Fatal *)&curr_2);
      }
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_58);
    }
  }
  else {
    startExistingFunction(this,pFVar1->func);
  }
  return;
}

Assistant:

void addUniqueSymbol(SeparatorReason reason) {
    if (auto curr = reason.getFuncStart()) {
      startExistingFunction(curr->func);
      return;
    }

    // instrCounter is managed manually and incremented at the beginning of
    // addUniqueSymbol() and visitExpression(), except for the case where we are
    // starting a new function, as that resets the counters back to 0.
    instrCounter++;

    ODBG(std::string desc);
    if (auto curr = reason.getBlockStart()) {
      ODBG(desc = "Block Start at ");
      ASSERT_OK(existingBuilder.visitBlockStart(curr->block));
    } else if (auto curr = reason.getIfStart()) {
      // IR builder needs the condition of the If pushed onto the builder before
      // visitIfStart(), which will expect to be able to pop the condition.
      // This is always okay to do because the correct condition was installed
      // onto the If when the outer scope was visited.
      existingBuilder.push(curr->iff->condition);
      ODBG(desc = "If Start at ");
      ASSERT_OK(existingBuilder.visitIfStart(curr->iff));
    } else if (reason.getElseStart()) {
      ODBG(desc = "Else Start at ");
      ASSERT_OK(existingBuilder.visitElse());
    } else if (auto curr = reason.getLoopStart()) {
      ODBG(desc = "Loop Start at ");
      ASSERT_OK(existingBuilder.visitLoopStart(curr->loop));
    } else if (reason.getEnd()) {
      ODBG(desc = "End at ");
      ASSERT_OK(existingBuilder.visitEnd());
      // Reset the function in case we just ended the function scope.
      existingBuilder.setFunction(func);
      // Outlining performs an unnested walk of the Wasm module, visiting
      // each scope one at a time. IRBuilder, in contrast, expects to
      // visit several nested scopes at a time. Thus, calling end() finalizes
      // the control flow and places it on IRBuilder's internal stack, ready for
      // the enclosing scope to consume its expressions off the stack. Since
      // outlining walks unnested, the enclosing scope never arrives to retrieve
      // its expressions off the stack, so we must call build() after visitEnd()
      // to clear the internal stack IRBuilder manages.
      ASSERT_OK(existingBuilder.build());
    } else {
      ODBG(desc = "addUniqueSymbol for unimplemented control flow ");
      WASM_UNREACHABLE("unimplemented control flow");
    }
    ODBG(printAddUniqueSymbol(desc));
  }